

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

void __thiscall DataSet::print(DataSet *this,uint n)

{
  ostream *poVar1;
  Shape *pSVar2;
  ulong uVar3;
  uint j;
  ulong uVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Dataset [");
  pSVar2 = Matrix::shape(&this->m_inputSet);
  poVar1 = operator<<(poVar1,pSVar2);
  poVar1 = std::operator<<(poVar1,"] - [");
  pSVar2 = Matrix::shape(&this->m_outputSet);
  poVar1 = operator<<(poVar1,pSVar2);
  poVar1 = std::operator<<(poVar1,"]: ");
  std::operator<<(poVar1,'\n');
  uVar3 = 0;
  while( true ) {
    if (uVar3 == n) {
      return;
    }
    pSVar2 = Matrix::shape(&this->m_inputSet);
    if ((pSVar2->field_0).m_dims[0] <= uVar3) break;
    for (uVar4 = 0; uVar4 < (this->m_inputSet).m_shape.field_0.m_dims[1]; uVar4 = uVar4 + 1) {
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)&(this->m_inputSet).m_vals.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                      super__Vector_base<double,_std::allocator<double>_> +
                           uVar4 * 8));
      std::operator<<(poVar1,",\t\t");
    }
    poVar1 = std::ostream::_M_insert<double>
                       (**(double **)
                          &(this->m_outputSet).m_vals.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar3].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl);
    std::operator<<(poVar1,'\n');
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void DataSet::print(uint n){
    std::cout<<"Dataset ["<<m_inputSet.shape()<<"] - ["<<m_outputSet.shape()<<"]: "<<'\n';
    for(uint i=0;i<n && i<m_inputSet.shape().n_row;++i){
        for(uint j=0;j<m_inputSet.m_shape.n_col;++j){
            std::cout<<m_inputSet.m_vals[i][j]<<",\t\t";
        }
        std::cout<<m_outputSet.m_vals[i][0]<<'\n';
    }
}